

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeContextCreate
          (ze_driver_handle_t hDriver,ze_context_desc_t *desc,ze_context_handle_t *phContext)

{
  ze_context_handle_t p_Var1;
  ze_pfnContextCreate_t pfnCreate;
  ze_result_t result;
  ze_context_handle_t *phContext_local;
  ze_context_desc_t *desc_local;
  ze_driver_handle_t hDriver_local;
  
  pfnCreate._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2d0 == (code *)0x0) {
    p_Var1 = (ze_context_handle_t)context_t::get((context_t *)&context);
    *phContext = p_Var1;
  }
  else {
    pfnCreate._4_4_ = (*DAT_0011c2d0)(hDriver,desc,phContext);
  }
  return pfnCreate._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextCreate(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver object
        const ze_context_desc_t* desc,                  ///< [in] pointer to context descriptor
        ze_context_handle_t* phContext                  ///< [out] pointer to handle of context object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreate = context.zeDdiTable.Context.pfnCreate;
        if( nullptr != pfnCreate )
        {
            result = pfnCreate( hDriver, desc, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }